

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O3

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,CallRef *curr,
          optional<wasm::HeapType> ht)

{
  bool *this_00;
  Expression **ppEVar1;
  size_t sVar2;
  size_t sVar3;
  Type *pTVar4;
  Type TVar5;
  long lVar6;
  Signature SVar7;
  Signature local_60;
  _Storage<wasm::HeapType,_true> local_50;
  optional<wasm::HeapType> ht_local;
  Type params;
  
  local_50 = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._8_8_ =
         wasm::Type::getHeapType(&curr->target->type);
    local_60 = HeapType::getSignature
                         ((HeapType *)
                          &ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_engaged);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)&local_50._M_value,&local_60);
  }
  SVar7 = HeapType::getSignature(&local_50._M_value);
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = SVar7.params.id;
  sVar3 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  sVar2 = wasm::Type::size((Type *)&ht_local.super__Optional_base<wasm::HeapType,_true,_true>.
                                    _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                    _M_engaged);
  if (sVar3 != sVar2) {
    __assert_fail("curr->operands.size() == params.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x34b,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef(CallRef *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  this_00 = &ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
  sVar3 = wasm::Type::size((Type *)this_00);
  if (sVar3 != 0) {
    lVar6 = 0;
    TVar5.id = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          TVar5.id) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar1 = (curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      local_60.results.id = TVar5.id;
      local_60.params.id = (uintptr_t)this_00;
      pTVar4 = wasm::Type::Iterator::operator*((Iterator *)&local_60);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,(Expression **)((long)ppEVar1 + lVar6),(Type)pTVar4->id
                );
      TVar5.id = TVar5.id + 1;
      sVar3 = wasm::Type::size((Type *)this_00);
      lVar6 = lVar6 + 8;
    } while (TVar5.id < sVar3);
  }
  if (((uint)(0x7c < (ulong)local_50) * 4 + 3 & local_50._0_4_) == 0) {
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->target,(Type)((ulong)local_50 | 2));
    return;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

void visitCallRef(CallRef* curr, std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->target->type.getHeapType().getSignature();
    }
    auto params = ht->getSignature().params;
    assert(curr->operands.size() == params.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->target, Type(*ht, Nullable));
  }